

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O3

void duckdb::AssertMaxFileSize(string *file_name,idx_t file_size)

{
  string *fmt_str;
  InvalidInputException *this;
  idx_t in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string file_byte_size_format;
  string max_byte_size_format;
  string error_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  string local_80;
  string local_60;
  string local_40;
  
  if (file_size >> 0x20 == 0) {
    return;
  }
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_60,(StringUtil *)0xffffffff,0x400,in_RCX)
  ;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_80,(StringUtil *)file_size,0x400,in_RCX);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,"File \'%s\' size (%s) exceeds maximum allowed file (%s)","");
  fmt_str = (string *)(file_name->_M_dataplus)._M_p;
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_c0,local_80._M_dataplus._M_p,
             local_80._M_dataplus._M_p + local_80._M_string_length);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_60._M_dataplus._M_p,
             local_60._M_dataplus._M_p + local_60._M_string_length);
  StringUtil::Format<char_const*,std::__cxx11::string,std::__cxx11::string>
            (&local_40,(StringUtil *)local_a0,fmt_str,(char *)local_c0,&local_e0,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0]);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,&local_40);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void AssertMaxFileSize(const string &file_name, idx_t file_size) {
	const auto max_file_size = NumericLimits<uint32_t>::Maximum();
	if (file_size > max_file_size) {
		auto max_byte_size_format = StringUtil::BytesToHumanReadableString(max_file_size);
		auto file_byte_size_format = StringUtil::BytesToHumanReadableString(file_size);
		auto error_msg = StringUtil::Format("File '%s' size (%s) exceeds maximum allowed file (%s)", file_name.c_str(),
		                                    file_byte_size_format, max_byte_size_format);
		throw InvalidInputException(error_msg);
	}
}